

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_grouping.cpp
# Opt level: O0

int16_t anon_unknown.dwarf_13b0cb::getMinGroupingForLocale(Locale *locale)

{
  UBool UVar1;
  char *localeID;
  UResourceBundle *pUVar2;
  UChar *pUVar3;
  char16_t *result;
  int32_t resultLen;
  LocalUResourceBundlePointer bundle;
  UErrorCode localStatus;
  Locale *locale_local;
  
  bundle.super_LocalPointerBase<UResourceBundle>.ptr._4_4_ = U_ZERO_ERROR;
  localeID = icu_63::Locale::getName(locale);
  pUVar2 = ures_open_63((char *)0x0,localeID,
                        (UErrorCode *)
                        ((long)&bundle.super_LocalPointerBase<UResourceBundle>.ptr + 4));
  icu_63::LocalUResourceBundlePointer::LocalUResourceBundlePointer
            ((LocalUResourceBundlePointer *)&stack0xffffffffffffffd8,pUVar2);
  result._4_4_ = 0;
  pUVar2 = icu_63::LocalPointerBase<UResourceBundle>::getAlias
                     ((LocalPointerBase<UResourceBundle> *)&stack0xffffffffffffffd8);
  pUVar3 = ures_getStringByKeyWithFallback_63
                     (pUVar2,"NumberElements/minimumGroupingDigits",(int32_t *)((long)&result + 4),
                      (UErrorCode *)((long)&bundle.super_LocalPointerBase<UResourceBundle>.ptr + 4))
  ;
  UVar1 = ::U_FAILURE(bundle.super_LocalPointerBase<UResourceBundle>.ptr._4_4_);
  if ((UVar1 == '\0') && (result._4_4_ == 1)) {
    locale_local._6_2_ = *pUVar3 + L'￐';
  }
  else {
    locale_local._6_2_ = 1;
  }
  icu_63::LocalUResourceBundlePointer::~LocalUResourceBundlePointer
            ((LocalUResourceBundlePointer *)&stack0xffffffffffffffd8);
  return locale_local._6_2_;
}

Assistant:

int16_t getMinGroupingForLocale(const Locale& locale) {
    // TODO: Cache this?
    UErrorCode localStatus = U_ZERO_ERROR;
    LocalUResourceBundlePointer bundle(ures_open(NULL, locale.getName(), &localStatus));
    int32_t resultLen = 0;
    const char16_t* result = ures_getStringByKeyWithFallback(
        bundle.getAlias(),
        "NumberElements/minimumGroupingDigits",
        &resultLen,
        &localStatus);
    // TODO: Is it safe to assume resultLen == 1? Would locales set minGrouping >= 10?
    if (U_FAILURE(localStatus) || resultLen != 1) {
        return 1;
    }
    return result[0] - u'0';
}